

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HessenbergDecomposition.h
# Opt level: O2

void Eigen::HessenbergDecomposition<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::_compute
               (MatrixType *matA,CoeffVectorType *hCoeffs,VectorType *temp)

{
  VectorType *workspace;
  bool bVar1;
  Index i;
  Index IStack_f0;
  Scalar h;
  CoeffVectorType *local_e0;
  VectorType *local_d8;
  RealScalar local_d0;
  Scalar local_c8;
  RealScalar beta;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>_> local_b8 [40];
  DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>_> local_90 [32];
  long local_70 [8];
  
  bVar1 = true;
  i = 0;
  local_e0 = hCoeffs;
  local_d8 = temp;
  while (bVar1) {
    Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>::Block
              ((Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true> *)local_b8,matA,i);
    DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>_>::tail
              ((SegmentReturnType *)local_70,local_b8,1);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>
    ::makeHouseholderInPlace
              ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
                *)local_70,&h,&beta);
    local_d0 = beta;
    Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>::Block
              ((Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true> *)local_70,matA,i);
    *(RealScalar *)(local_70[0] + 8) = local_d0;
    local_e0[i].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
    [0] = h;
    DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::bottomRightCorner
              ((Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false> *)local_b8,
               (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)matA,1,1);
    Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>::Block
              ((Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true> *)local_90,matA,i);
    DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>_>::tail
              ((SegmentReturnType *)local_70,local_90,0);
    workspace = local_d8;
    MatrixBase<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,-1,-1,false>>::
    applyHouseholderOnTheLeft<Eigen::VectorBlock<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1>>
              ((MatrixBase<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>> *)local_b8,
               (VectorBlock<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1> *)
               local_70,&h,(Scalar *)local_d8);
    IStack_f0 = 1;
    DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::rightCols
              ((ColsBlockXpr *)local_b8,(DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)matA,1);
    Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>::Block
              ((Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true> *)local_90,matA,i);
    DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>_>::tail
              ((SegmentReturnType *)local_70,local_90,0);
    local_c8 = h;
    MatrixBase<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,-1,true>>::
    applyHouseholderOnTheRight<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>>
              ((MatrixBase<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,_1,true>> *)local_b8,
               (Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>
                *)local_70,&local_c8,(Scalar *)workspace);
    bVar1 = false;
    i = IStack_f0;
  }
  return;
}

Assistant:

void HessenbergDecomposition<MatrixType>::_compute(MatrixType& matA, CoeffVectorType& hCoeffs, VectorType& temp)
{
  eigen_assert(matA.rows()==matA.cols());
  Index n = matA.rows();
  temp.resize(n);
  for (Index i = 0; i<n-1; ++i)
  {
    // let's consider the vector v = i-th column starting at position i+1
    Index remainingSize = n-i-1;
    RealScalar beta;
    Scalar h;
    matA.col(i).tail(remainingSize).makeHouseholderInPlace(h, beta);
    matA.col(i).coeffRef(i+1) = beta;
    hCoeffs.coeffRef(i) = h;

    // Apply similarity transformation to remaining columns,
    // i.e., compute A = H A H'

    // A = H A
    matA.bottomRightCorner(remainingSize, remainingSize)
        .applyHouseholderOnTheLeft(matA.col(i).tail(remainingSize-1), h, &temp.coeffRef(0));

    // A = A H'
    matA.rightCols(remainingSize)
        .applyHouseholderOnTheRight(matA.col(i).tail(remainingSize-1).conjugate(), numext::conj(h), &temp.coeffRef(0));
  }
}